

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiAnalyzer.cpp
# Opt level: O3

void __thiscall EnrichableSpiAnalyzer::GetWord(EnrichableSpiAnalyzer *this)

{
  pointer puVar1;
  iterator iVar2;
  EnrichableAnalyzerSubprocess *this_00;
  bool bVar3;
  undefined8 uVar4;
  U64 UVar5;
  U64 packetId;
  Marker *marker;
  ulong uVar6;
  pointer pMVar7;
  int iVar8;
  int iVar9;
  U32 UVar10;
  ulong uVar11;
  Channel *pCVar12;
  DataBuilder miso_result;
  DataBuilder mosi_result;
  U64 miso_word;
  U64 mosi_word;
  vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
  markers;
  Frame result_frame;
  DataBuilder aDStack_98 [8];
  DataBuilder local_90 [8];
  vector<unsigned_long_long,std::allocator<unsigned_long_long>> *local_88;
  undefined8 local_80;
  undefined8 local_78;
  vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
  local_70;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  U8 local_38;
  undefined1 local_37;
  
  UVar10 = ((this->mSettings)._M_ptr)->mBitsPerTransfer;
  DataBuilder::DataBuilder(local_90);
  local_78 = 0;
  DataBuilder::Reset((ulonglong *)local_90,(ShiftOrder)&local_78,
                     ((this->mSettings)._M_ptr)->mShiftOrder);
  DataBuilder::DataBuilder(aDStack_98);
  local_80 = 0;
  DataBuilder::Reset((ulonglong *)aDStack_98,(ShiftOrder)&local_80,
                     ((this->mSettings)._M_ptr)->mShiftOrder);
  puVar1 = (this->mArrowLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mArrowLocations).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->mArrowLocations).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  AnalyzerChannelData::GetSampleNumber();
  Analyzer::ReportProgress((ulonglong)this);
  iVar8 = 0;
  if (UVar10 == 0) {
    uVar4 = 0;
  }
  else {
    local_88 = (vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
               &this->mArrowLocations;
    uVar4 = 0;
    do {
      if (iVar8 == 0) {
        Analyzer::CheckIfThreadShouldExit();
      }
      bVar3 = WouldAdvancingTheClockToggleEnable(this);
      if (bVar3) {
LAB_00108719:
        AdvanceToActiveEnableEdgeWithCorrectClockPolarity(this);
        goto LAB_001088c1;
      }
      AnalyzerChannelData::AdvanceToNextEdge();
      iVar9 = iVar8 + -1;
      if (iVar8 == 0) {
        uVar4 = AnalyzerChannelData::GetSampleNumber();
      }
      if (((this->mSettings)._M_ptr)->mDataValidEdge == LeadingEdge) {
        UVar5 = AnalyzerChannelData::GetSampleNumber();
        this->mCurrentSample = UVar5;
        if (this->mMosi != (AnalyzerChannelData *)0x0) {
          AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMosi);
          AnalyzerChannelData::GetBitState();
          DataBuilder::AddBit((BitState)local_90);
        }
        if (this->mMiso != (AnalyzerChannelData *)0x0) {
          AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMiso);
          AnalyzerChannelData::GetBitState();
          DataBuilder::AddBit((BitState)aDStack_98);
        }
        iVar2._M_current =
             (this->mArrowLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->mArrowLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
          _M_realloc_insert<unsigned_long_long_const&>(local_88,iVar2,&this->mCurrentSample);
        }
        else {
          *iVar2._M_current = this->mCurrentSample;
          (this->mArrowLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
      if ((iVar8 + UVar10 == 1) && (((this->mSettings)._M_ptr)->mDataValidEdge != TrailingEdge)) {
        bVar3 = WouldAdvancingTheClockToggleEnable(this);
        iVar8 = 1;
        if (bVar3) goto LAB_00108744;
        AnalyzerChannelData::AdvanceToNextEdge();
        break;
      }
      bVar3 = WouldAdvancingTheClockToggleEnable(this);
      if (bVar3) goto LAB_00108719;
      AnalyzerChannelData::AdvanceToNextEdge();
      if (((this->mSettings)._M_ptr)->mDataValidEdge == TrailingEdge) {
        UVar5 = AnalyzerChannelData::GetSampleNumber();
        this->mCurrentSample = UVar5;
        if (this->mMosi != (AnalyzerChannelData *)0x0) {
          AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMosi);
          AnalyzerChannelData::GetBitState();
          DataBuilder::AddBit((BitState)local_90);
        }
        if (this->mMiso != (AnalyzerChannelData *)0x0) {
          AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMiso);
          AnalyzerChannelData::GetBitState();
          DataBuilder::AddBit((BitState)aDStack_98);
        }
        iVar2._M_current =
             (this->mArrowLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (this->mArrowLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
          _M_realloc_insert<unsigned_long_long_const&>(local_88,iVar2,&this->mCurrentSample);
        }
        else {
          *iVar2._M_current = this->mCurrentSample;
          (this->mArrowLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
      iVar8 = iVar9;
    } while (UVar10 + iVar9 != 0);
    iVar8 = 0;
  }
LAB_00108744:
  Frame::Frame((Frame *)&local_58);
  local_58 = uVar4;
  local_50 = AnalyzerChannelData::GetSampleNumber();
  local_48 = local_78;
  local_40 = local_80;
  local_37 = 0;
  local_38 = this->packetFrameIndex;
  this->packetFrameIndex = local_38 + '\x01';
  UVar5 = AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
  uVar11 = (ulong)((long)(this->mArrowLocations).
                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->mArrowLocations).
                        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 3;
  UVar10 = (U32)uVar11;
  if (UVar10 != 0) {
    uVar6 = 0;
    do {
      AnalyzerResults::AddMarker
                ((ulonglong)(this->mResults)._M_ptr,
                 (MarkerType)
                 (this->mArrowLocations).
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar6],(Channel *)(ulong)this->mArrowMarker);
      uVar6 = uVar6 + 1;
    } while ((uVar11 & 0xffffffff) != uVar6);
  }
  bVar3 = EnrichableAnalyzerSubprocess::MarkerEnabled((this->mSubprocess)._M_ptr);
  if (bVar3) {
    this_00 = (this->mSubprocess)._M_ptr;
    packetId = AnalyzerResults::GetNumPackets();
    EnrichableAnalyzerSubprocess::EmitMarker
              (&local_70,this_00,packetId,UVar5,(Frame *)&local_58,UVar10);
    if (local_70.
        super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_70.
        super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar12 = (Channel *)0x0;
      pMVar7 = local_70.
               super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar9 = std::__cxx11::string::compare((char *)&pMVar7->channelName);
        if (iVar9 == 0) {
          pCVar12 = &((this->mSettings)._M_ptr)->mMisoChannel;
        }
        else {
          iVar9 = std::__cxx11::string::compare((char *)&pMVar7->channelName);
          if (iVar9 == 0) {
            pCVar12 = &((this->mSettings)._M_ptr)->mMosiChannel;
          }
          else if (pCVar12 == (Channel *)0x0) break;
        }
        AnalyzerResults::AddMarker
                  ((ulonglong)(this->mResults)._M_ptr,
                   (MarkerType)
                   (this->mArrowLocations).
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[pMVar7->sampleNumber],
                   (Channel *)(ulong)pMVar7->markerType);
        pMVar7 = pMVar7 + 1;
      } while (pMVar7 != local_70.
                         super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
    ::~vector(&local_70);
  }
  AnalyzerResults::CommitResults();
  if ((char)iVar8 != '\0') {
    AdvanceToActiveEnableEdgeWithCorrectClockPolarity(this);
  }
  Frame::~Frame((Frame *)&local_58);
LAB_001088c1:
  DataBuilder::~DataBuilder(aDStack_98);
  DataBuilder::~DataBuilder(local_90);
  return;
}

Assistant:

void EnrichableSpiAnalyzer::GetWord()
{
	//we're assuming we come into this function with the clock in the idle state;

	U32 bits_per_transfer = mSettings->mBitsPerTransfer;

	DataBuilder mosi_result;
	U64 mosi_word = 0;
	mosi_result.Reset( &mosi_word, mSettings->mShiftOrder, bits_per_transfer );

	DataBuilder miso_result;
	U64 miso_word = 0;
	miso_result.Reset( &miso_word, mSettings->mShiftOrder, bits_per_transfer );

	U64 first_sample = 0;
	bool need_reset = false;

	mArrowLocations.clear();
	ReportProgress( mClock->GetSampleNumber() );

	for( U32 i=0; i<bits_per_transfer; i++ )
	{
		if( i == 0 )
			CheckIfThreadShouldExit();

		//on every single edge, we need to check that enable doesn't toggle.
		//note that we can't just advance the enable line to the next edge, becuase there may not be another edge

		if( WouldAdvancingTheClockToggleEnable() == true )
		{
			AdvanceToActiveEnableEdgeWithCorrectClockPolarity();  //ok, we pretty much need to reset everything and return.
			return;
		}
		
		mClock->AdvanceToNextEdge();
		if( i == 0 )
			first_sample = mClock->GetSampleNumber();

		if( mSettings->mDataValidEdge == AnalyzerEnums::LeadingEdge )
		{
			mCurrentSample = mClock->GetSampleNumber();
			if( mMosi != NULL )
			{
				mMosi->AdvanceToAbsPosition( mCurrentSample );
				mosi_result.AddBit( mMosi->GetBitState() );
			}
			if( mMiso != NULL )
			{
				mMiso->AdvanceToAbsPosition( mCurrentSample );
				miso_result.AddBit( mMiso->GetBitState() );
			}
			mArrowLocations.push_back( mCurrentSample );
		}


		// ok, the trailing edge is messy -- but only on the very last bit.
		// If the trialing edge isn't doesn't represent valid data, we want to allow the enable line to rise before the clock trialing edge -- and still report the frame
		if( ( i == ( bits_per_transfer - 1 ) ) && ( mSettings->mDataValidEdge != AnalyzerEnums::TrailingEdge ) )
		{
			//if this is the last bit, and the trailing edge doesn't represent valid data
			if( WouldAdvancingTheClockToggleEnable() == true )
			{
				//moving to the trailing edge would cause the clock to revert to inactive.  jump out, record the frame, and them move to the next active enable edge
				need_reset = true;
				break;
			}
			
			//enable isn't going to go inactive, go ahead and advance the clock as usual.  Then we're done, jump out and record the frame.
			mClock->AdvanceToNextEdge();
			break;
		}
		
		//this isn't the very last bit, etc, so proceed as normal
		if( WouldAdvancingTheClockToggleEnable() == true )
		{
			AdvanceToActiveEnableEdgeWithCorrectClockPolarity();  //ok, we pretty much need to reset everything and return.
			return;
		}

		mClock->AdvanceToNextEdge();

		if( mSettings->mDataValidEdge == AnalyzerEnums::TrailingEdge )
		{
			mCurrentSample = mClock->GetSampleNumber();
			if( mMosi != NULL )
			{
				mMosi->AdvanceToAbsPosition( mCurrentSample );
				mosi_result.AddBit( mMosi->GetBitState() );
			}
			if( mMiso != NULL )
			{
				mMiso->AdvanceToAbsPosition( mCurrentSample );
				miso_result.AddBit( mMiso->GetBitState() );
			}
			mArrowLocations.push_back( mCurrentSample );
		}
		
	}

	Frame result_frame;
	result_frame.mStartingSampleInclusive = first_sample;
	result_frame.mEndingSampleInclusive = mClock->GetSampleNumber();
	result_frame.mData1 = mosi_word;
	result_frame.mData2 = miso_word;
	result_frame.mFlags = 0;
	result_frame.mType = packetFrameIndex++;
	U64 frameIndex = mResults->AddFrame( result_frame );

	//save the resuls:
	U32 count = mArrowLocations.size();
	for( U32 i=0; i<count; i++ ) {
		mResults->AddMarker(
			mArrowLocations[i], mArrowMarker, mSettings->mClockChannel
		);
	}

	if(mSubprocess->MarkerEnabled()) {
		std::vector<EnrichableAnalyzerSubprocess::Marker> markers = mSubprocess->EmitMarker(
			mResults->GetNumPackets(),
			frameIndex,
			result_frame,
			count
		);

		Channel* channel = NULL;
		for(const EnrichableAnalyzerSubprocess::Marker& marker : markers) {
			if(marker.channelName == "miso") {
				channel = &mSettings->mMisoChannel;
			} else if (marker.channelName == "mosi") {
				channel = &mSettings->mMosiChannel;
			}
			if(channel != NULL) {
				mResults->AddMarker(
					mArrowLocations[marker.sampleNumber],
					marker.markerType,
					*channel
				);
			} else {
				break;
				std::cerr << "Received marker request for invalid marker: ";
				std::cerr << marker.channelName;
				std::cerr << " ignoring.\n";
			}
		}
	}
	
	mResults->CommitResults();

	if( need_reset == true )
		AdvanceToActiveEnableEdgeWithCorrectClockPolarity();
}